

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void envy_bios_print_bit_M(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_mem *mem;
  envy_bios_bit_entry *peVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  char *name;
  envy_bios_bit_entry *local_38;
  
  local_38 = (bios->mem).bit;
  if ((mask >> 0xc & 1) != 0 && local_38 != (envy_bios_bit_entry *)0x0) {
    mem = &bios->mem;
    fprintf((FILE *)out,"BIT table \'M\' at 0x%x, version %i\n",(ulong)local_38->offset,
            (ulong)local_38->version);
    peVar1 = mem->bit;
    if (1 < peVar1->t_len) {
      uVar4 = 1;
      lVar3 = 2;
      do {
        uVar2 = (ulong)peVar1->t_offset;
        if ((uint)(uVar2 + lVar3) < bios->length) {
          uVar5 = (uint)CONCAT11(bios->data[uVar2 + lVar3 & 0xffffffff],bios->data[uVar4 + uVar2]);
          if (uVar5 != 0) {
            local_38 = (envy_bios_bit_entry *)0x27639e;
            parse_at(bios,mem,-1,(int)uVar4,(char **)&local_38);
            fprintf((FILE *)out,"0x%02x: 0x%x => %s TABLE\n",uVar4 & 0xffffffff,(ulong)uVar5,
                    local_38);
          }
        }
        else {
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar2 + uVar4);
        }
        peVar1 = mem->bit;
        uVar4 = uVar4 + 2;
        lVar3 = lVar3 + 2;
      } while ((uint)uVar4 < (uint)peVar1->t_len);
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void
envy_bios_print_bit_M (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem *mem = &bios->mem;
	const char *name;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!mem->bit || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "BIT table 'M' at 0x%x, version %i\n",
			mem->bit->offset, mem->bit->version);

	for (i = 1; i < mem->bit->t_len; i+=2) {
		ret = bios_u16(bios, mem->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, mem, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}

	fprintf(out, "\n");
}